

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<int>,_testing::internal::ValueArray<int,_int>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int> *in_RSI;
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>_>
  *in_RDI;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> PVar1;
  tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<int>,_testing::internal::ValueArray<int,_int>_>
  *in_stack_ffffffffffffff88;
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>_>
  *g;
  
  g = in_RDI;
  operator_new(0x38);
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>_>
  ::
  tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<int>,_testing::internal::ValueArray<int,_int>,_true,_true>
            (in_RDI,in_stack_ffffffffffffff88);
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int>::
  CartesianProductGenerator(in_RSI,g);
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>::ParamGenerator
            ((ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_> *)
             in_RDI,(ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>
                     *)in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>_>
            *)0x8ccb4b);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)g;
  return (ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }